

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

bool check_in_8_handles(Am_Object *sel_handles,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int height_d2;
  int width_d2;
  int height;
  int width;
  int y_local;
  int x_local;
  Am_Object *sel_handles_local;
  
  pAVar4 = Am_Object::Get(sel_handles,0x66,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(sel_handles,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  iVar3 = iVar2 / 2;
  if (x < 0xe) {
    if (y < 0xe) {
      return true;
    }
    if ((iVar3 + -7 <= y) && (y <= iVar3 + 7)) {
      return true;
    }
    if (iVar2 + -0xd < y) {
      return true;
    }
  }
  else if ((x < iVar1 / 2 + -7) || (iVar1 / 2 + 7 < x)) {
    if (iVar1 + -0xd < x) {
      if (y < 0xe) {
        return true;
      }
      if ((iVar3 + -7 <= y) && (y <= iVar3 + 7)) {
        return true;
      }
      if (iVar2 + -0xd < y) {
        return true;
      }
    }
  }
  else {
    if (y < 0xe) {
      return true;
    }
    if (iVar2 + -0xd < y) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
check_in_8_handles(Am_Object sel_handles, int x, int y)
{
  int width = sel_handles.Get(Am_WIDTH);
  int height = sel_handles.Get(Am_HEIGHT);

  int width_d2 = width / 2;
  int height_d2 = height / 2;

  if (x <= HANDLE_SIZE) {
    // left-top
    if (y <= HANDLE_SIZE)
      return true;
    // left-middle
    if (y >= height_d2 - HANDLE_SIZE_D2 && y <= height_d2 + HANDLE_SIZE_D2)
      return true;
    // left-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  } else if (x >= width_d2 - HANDLE_SIZE_D2 && x <= width_d2 + HANDLE_SIZE_D2) {
    // middle-top
    if (y <= HANDLE_SIZE)
      return true;
    // middle-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  } else if (x > width - HANDLE_SIZE) {
    // right-top
    if (y <= HANDLE_SIZE)
      return true;
    // right-middle
    if (y >= height_d2 - HANDLE_SIZE_D2 && y <= height_d2 + HANDLE_SIZE_D2)
      return true;
    // right-bottom
    if (y > height - HANDLE_SIZE)
      return true;
  }
  //if get here, then not over a handle
  return false;
}